

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int addUserPropertiesTouMqttMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,STRING_HANDLE topic_string,
              size_t *index_ptr,_Bool urlencode)

{
  size_t *handle;
  MAP_RESULT MVar1;
  int iVar2;
  MAP_HANDLE handle_00;
  LOGGER_LOG p_Var3;
  STRING_HANDLE handle_01;
  STRING_HANDLE handle_02;
  char *pcVar4;
  char *pcVar5;
  char *local_c8;
  char *local_a8;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  STRING_HANDLE property_value;
  STRING_HANDLE property_key;
  LOGGER_LOG l;
  MAP_HANDLE properties_map;
  size_t index;
  size_t propertyCount;
  char **propertyValues;
  char **propertyKeys;
  int result;
  _Bool urlencode_local;
  size_t *index_ptr_local;
  STRING_HANDLE topic_string_local;
  IOTHUB_MESSAGE_HANDLE iothub_message_handle_local;
  
  propertyKeys._0_4_ = 0;
  properties_map = (MAP_HANDLE)*index_ptr;
  propertyKeys._7_1_ = urlencode;
  _result = index_ptr;
  index_ptr_local = (size_t *)topic_string;
  topic_string_local = (STRING_HANDLE)iothub_message_handle;
  handle_00 = IoTHubMessage_Properties(iothub_message_handle);
  if (handle_00 != (MAP_HANDLE)0x0) {
    MVar1 = Map_GetInternals(handle_00,&propertyValues,(char ***)&propertyCount,&index);
    if (MVar1 == MAP_OK) {
      if (index != 0) {
        for (properties_map = (MAP_HANDLE)0x0; properties_map < index && (int)propertyKeys == 0;
            properties_map = (MAP_HANDLE)((long)&properties_map->keys + 1)) {
          if ((propertyKeys._7_1_ & 1) == 0) {
            if ((MAP_HANDLE)(index - 1) == properties_map) {
              local_c8 = "";
            }
            else {
              local_c8 = PROPERTY_SEPARATOR;
            }
            iVar2 = STRING_sprintf((STRING_HANDLE)index_ptr_local,"%s=%s%s",
                                   propertyValues[(long)properties_map],
                                   *(undefined8 *)(propertyCount + (long)properties_map * 8),
                                   local_c8);
            if (iVar2 != 0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                          ,"addUserPropertiesTouMqttMessage",0x2dc,1,
                          "Failed constructing property string.");
              }
              propertyKeys._0_4_ = 0x2dd;
            }
          }
          else {
            handle_01 = URL_EncodeString(propertyValues[(long)properties_map]);
            handle_02 = URL_EncodeString(*(char **)(propertyCount + (long)properties_map * 8));
            handle = index_ptr_local;
            if ((handle_01 == (STRING_HANDLE)0x0) || (handle_02 == (STRING_HANDLE)0x0)) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                          ,"addUserPropertiesTouMqttMessage",0x2cd,1,
                          "Failed URL Encoding properties");
              }
              propertyKeys._0_4_ = 0x2ce;
            }
            else {
              pcVar4 = STRING_c_str(handle_01);
              pcVar5 = STRING_c_str(handle_02);
              if ((MAP_HANDLE)(index - 1) == properties_map) {
                local_a8 = "";
              }
              else {
                local_a8 = PROPERTY_SEPARATOR;
              }
              iVar2 = STRING_sprintf((STRING_HANDLE)handle,"%s=%s%s",pcVar4,pcVar5,local_a8);
              if (iVar2 != 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                            ,"addUserPropertiesTouMqttMessage",0x2d2,1,
                            "Failed constructing property string.");
                }
                propertyKeys._0_4_ = 0x2d3;
              }
            }
            STRING_delete(handle_01);
            STRING_delete(handle_02);
          }
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"addUserPropertiesTouMqttMessage",0x2be,1,
                  "Failed to get the internals of the property map.");
      }
      propertyKeys._0_4_ = 0x2bf;
    }
  }
  *_result = (size_t)properties_map;
  return (int)propertyKeys;
}

Assistant:

static int addUserPropertiesTouMqttMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, STRING_HANDLE topic_string, size_t* index_ptr, bool urlencode)
{
    int result = 0;
    const char* const* propertyKeys;
    const char* const* propertyValues;
    size_t propertyCount;
    size_t index = *index_ptr;
    MAP_HANDLE properties_map = IoTHubMessage_Properties(iothub_message_handle);
    if (properties_map != NULL)
    {
        if (Map_GetInternals(properties_map, &propertyKeys, &propertyValues, &propertyCount) != MAP_OK)
        {
            LogError("Failed to get the internals of the property map.");
            result = MU_FAILURE;
        }
        else
        {
            if (propertyCount != 0)
            {
                for (index = 0; index < propertyCount && result == 0; index++)
                {
                    if (urlencode)
                    {
                        STRING_HANDLE property_key = URL_EncodeString(propertyKeys[index]);
                        STRING_HANDLE property_value = URL_EncodeString(propertyValues[index]);
                        if ((property_key == NULL) || (property_value == NULL))
                        {
                            LogError("Failed URL Encoding properties");
                            result = MU_FAILURE;
                        }
                        else if (STRING_sprintf(topic_string, "%s=%s%s", STRING_c_str(property_key), STRING_c_str(property_value), propertyCount - 1 == index ? "" : PROPERTY_SEPARATOR) != 0)
                        {
                            LogError("Failed constructing property string.");
                            result = MU_FAILURE;
                        }
                        STRING_delete(property_key);
                        STRING_delete(property_value);
                    }
                    else
                    {
                        if (STRING_sprintf(topic_string, "%s=%s%s", propertyKeys[index], propertyValues[index], propertyCount - 1 == index ? "" : PROPERTY_SEPARATOR) != 0)
                        {
                            LogError("Failed constructing property string.");
                            result = MU_FAILURE;
                        }
                    }
                }
            }
        }
    }
    *index_ptr = index;
    return result;
}